

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

bool __thiscall SQFuncState::IsConstant(SQFuncState *this,SQObject *name,SQObject *e)

{
  bool bVar1;
  undefined8 *in_RDX;
  SQObject *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectPtr val;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  SQObjectValue in_stack_ffffffffffffffc8;
  SQObject local_30;
  undefined8 *local_20;
  SQObject *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&local_30);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0,local_18);
  bVar1 = SQTable::Get(in_stack_ffffffffffffffc8.pTable,in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  if (bVar1) {
    *local_20 = local_30._0_8_;
    *(SQObjectValue *)(local_20 + 1) = local_30._unVal;
  }
  local_1 = bVar1;
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool SQFuncState::IsConstant(const SQObject &name,SQObject &e)
{
    SQObjectPtr val;
    if(_table(_sharedstate->_consts)->Get(name,val)) {
        e = val;
        return true;
    }
    return false;
}